

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sCreate_CompRow_Matrix
               (SuperMatrix *A,int m,int n,int_t nnz,float *nzval,int_t *colind,int_t *rowptr,
               Stype_t stype,Dtype_t dtype,Mtype_t mtype)

{
  int_t *piVar1;
  void *pvVar2;
  char acStack_138 [264];
  
  A->Stype = stype;
  A->Dtype = dtype;
  A->Mtype = mtype;
  A->nrow = m;
  A->ncol = n;
  pvVar2 = superlu_malloc(0x20);
  A->Store = pvVar2;
  if (pvVar2 == (void *)0x0) {
    sprintf(acStack_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for A->Store",0x48,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sutil.c");
    superlu_abort_and_exit(acStack_138);
  }
  piVar1 = (int_t *)A->Store;
  *piVar1 = nnz;
  *(float **)(piVar1 + 2) = nzval;
  *(int_t **)(piVar1 + 4) = colind;
  *(int_t **)(piVar1 + 6) = rowptr;
  return;
}

Assistant:

void
sCreate_CompRow_Matrix(SuperMatrix *A, int m, int n, int_t nnz, 
		       float *nzval, int_t *colind, int_t *rowptr,
		       Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    NRformat *Astore;

    A->Stype = stype;
    A->Dtype = dtype;
    A->Mtype = mtype;
    A->nrow = m;
    A->ncol = n;
    A->Store = (void *) SUPERLU_MALLOC( sizeof(NRformat) );
    if ( !(A->Store) ) ABORT("SUPERLU_MALLOC fails for A->Store");
    Astore = A->Store;
    Astore->nnz = nnz;
    Astore->nzval = nzval;
    Astore->colind = colind;
    Astore->rowptr = rowptr;
}